

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar1;
  ArrayIndex index;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar2;
  Value VStack_48;
  
  if (this->field_0x8 == '\0') {
    Value(&VStack_48,arrayValue);
    operator=(this,&VStack_48);
    ~Value(&VStack_48);
  }
  else if (this->field_0x8 != '\x06') {
    __assert_fail("type_ == nullValue || type_ == arrayValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x41b,"void Json::Value::resize(ArrayIndex)");
  }
  AVar1 = size(this);
  if (newSize == 0) {
    clear(this);
  }
  else if (AVar1 < newSize) {
    operator[](this,newSize - 1);
  }
  else {
    index = newSize;
    if (newSize < AVar1) {
      do {
        this_00 = &((this->value_).map_)->_M_t;
        CZString::CZString((CZString *)&VStack_48,index);
        pVar2 = std::
                _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                ::equal_range(this_00,(key_type *)&VStack_48);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::_M_erase_aux(this_00,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
        CZString::~CZString((CZString *)&VStack_48);
        index = index + 1;
      } while (AVar1 != index);
    }
    AVar1 = size(this);
    if (AVar1 != newSize) {
      __assert_fail("size() == newSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                    ,0x42a,"void Json::Value::resize(ArrayIndex)");
    }
  }
  return;
}

Assistant:

void 
Value::resize( ArrayIndex newSize )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == arrayValue );
   if ( type_ == nullValue )
      *this = Value( arrayValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   ArrayIndex oldSize = size();
   if ( newSize == 0 )
      clear();
   else if ( newSize > oldSize )
      (*this)[ newSize - 1 ];
   else
   {
      for ( ArrayIndex index = newSize; index < oldSize; ++index )
      {
         value_.map_->erase( index );
      }
      assert( size() == newSize );
   }
#else
   value_.array_->resize( newSize );
#endif
}